

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::valtype<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *__rhs;
  bool bVar1;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  string_view expected_06;
  string_view expected_07;
  string_view expected_08;
  string_view expected_09;
  string_view expected_10;
  string_view expected_11;
  string_view expected_12;
  string local_e0;
  string local_c0;
  undefined1 local_a0 [8];
  MaybeResult<wasm::WATParser::Ok> type;
  Result<wasm::WATParser::Ok> type_1;
  Result<wasm::WATParser::Ok> _val;
  
  expected._M_str = "i32";
  expected._M_len = 3;
  bVar1 = ParseInput::takeKeyword(&ctx->in,expected);
  if ((((!bVar1) &&
       (expected_00._M_str = "i64", expected_00._M_len = 3,
       bVar1 = ParseInput::takeKeyword(&ctx->in,expected_00), !bVar1)) &&
      (expected_01._M_str = "f32", expected_01._M_len = 3,
      bVar1 = ParseInput::takeKeyword(&ctx->in,expected_01), !bVar1)) &&
     ((expected_02._M_str = "f64", expected_02._M_len = 3,
      bVar1 = ParseInput::takeKeyword(&ctx->in,expected_02), !bVar1 &&
      (expected_03._M_str = "v128", expected_03._M_len = 4,
      bVar1 = ParseInput::takeKeyword(&ctx->in,expected_03), !bVar1)))) {
    expected_04._M_str = "funcref";
    expected_04._M_len = 7;
    bVar1 = ParseInput::takeKeyword(&ctx->in,expected_04);
    if ((((bVar1) ||
         ((expected_05._M_str = "externref", expected_05._M_len = 9,
          bVar1 = ParseInput::takeKeyword(&ctx->in,expected_05), bVar1 ||
          (expected_06._M_str = "anyref", expected_06._M_len = 6,
          bVar1 = ParseInput::takeKeyword(&ctx->in,expected_06), bVar1)))) ||
        (expected_07._M_str = "eqref", expected_07._M_len = 5,
        bVar1 = ParseInput::takeKeyword(&ctx->in,expected_07), bVar1)) ||
       ((expected_08._M_str = "i31ref", expected_08._M_len = 6,
        bVar1 = ParseInput::takeKeyword(&ctx->in,expected_08), bVar1 ||
        (expected_09._M_str = "structref", expected_09._M_len = 9,
        bVar1 = ParseInput::takeKeyword(&ctx->in,expected_09), bVar1)))) {
      type.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
      .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
      ._M_u._24_1_ = 0;
    }
    else {
      expected_10._M_str = "arrayref";
      expected_10._M_len = 8;
      bVar1 = ParseInput::takeKeyword(&ctx->in,expected_10);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((long)&type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                           .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                   ,"arrayref not yet supported",(allocator<char> *)&local_c0);
        ParseInput::err((Err *)((long)&type.val.
                                       super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                               + 0x20),&ctx->in,
                        (string *)
                        ((long)&type_1.val.
                                super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                        0x20));
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>::
        _Variant_storage<2ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                    *)local_a0,
                   (__index_type *)
                   ((long)&type.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&type.val.
                           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                   + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                           .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                  );
      }
      else {
        expected_11._M_str = "ref";
        expected_11._M_len = 3;
        bVar1 = ParseInput::takeSExprStart(&ctx->in,expected_11);
        if (bVar1) {
          expected_12._M_str = "null";
          expected_12._M_len = 4;
          ParseInput::takeKeyword(&ctx->in,expected_12);
          __rhs = (__index_type *)
                  ((long)&type.val.
                          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                  + 0x20);
          heaptype<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
                    ((Result<wasm::WATParser::Ok> *)__rhs,ctx);
          std::__detail::__variant::
          _Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::_Copy_ctor_base
                    ((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                     ((long)&type_1.val.
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                     0x20),(_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                           __rhs);
          if (_val.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ ==
              '\x01') {
            std::__cxx11::string::string
                      ((string *)&local_c0,
                       (string *)
                       ((long)&type_1.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                       0x20));
            std::__detail::__variant::
            _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>::
            _Variant_storage<2ul,wasm::WATParser::Err>
                      ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                        *)local_a0,&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::~_Variant_storage
                      ((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                       ((long)&type_1.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                       0x20));
          }
          else {
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::~_Variant_storage
                      ((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                       ((long)&type_1.val.
                               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                       0x20));
            bVar1 = ParseInput::takeRParen(&ctx->in);
            if (bVar1) {
              type.val.
              super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
              ._M_u._24_1_ = 0;
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_c0,"expected end of reftype",
                         (allocator<char> *)
                         ((long)&_val.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                         0x27));
              ParseInput::err((Err *)((long)&type_1.val.
                                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                             .
                                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                             .
                                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                             .
                                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                     + 0x20),&ctx->in,&local_c0);
              std::__detail::__variant::
              _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
              ::_Variant_storage<2ul,wasm::WATParser::Err>
                        ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                          *)local_a0,
                         (__index_type *)
                         ((long)&type_1.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                         0x20));
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&type_1.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>
                                 .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                         0x20));
              std::__cxx11::string::~string((string *)&local_c0);
            }
          }
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::Err> *)
                     ((long)&type.val.
                             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                     + 0x20));
        }
        else {
          type.val.
          super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          .super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
          ._M_u._24_1_ = 1;
        }
      }
    }
    if (type.val.
        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
        ._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"expected valtype",
                 (allocator<char> *)
                 ((long)&type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20));
      ParseInput::err((Err *)((long)&type.val.
                                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             + 0x20),&ctx->in,&local_e0);
      std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>::
      _Variant_storage<1ul,wasm::WATParser::Err>
                ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err> *)
                 __return_storage_ptr__,
                 (__index_type *)
                 ((long)&type.val.
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&type.val.
                         super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x20));
      std::__cxx11::string::~string((string *)&local_e0);
    }
    else {
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)((long)&type.val.
                                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                         + 0x20),
                      (_Copy_ctor_base<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)local_a0);
      if (type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>._M_u._24_1_ ==
          '\x02') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                           .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                   ,(string *)
                    ((long)&type.val.
                            super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                    + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>::
        _Variant_storage<1ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err> *)
                   __return_storage_ptr__,
                   (__index_type *)
                   ((long)&type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                           .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                  );
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&type_1.val.super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
                           .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20)
                  );
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)((long)&type.val.
                                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             + 0x20));
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                           *)((long)&type.val.
                                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                             + 0x20));
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
             '\0';
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
                       *)local_a0);
    return __return_storage_ptr__;
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeT> valtype(Ctx& ctx) {
  if (ctx.in.takeKeyword("i32"sv)) {
    return ctx.makeI32();
  } else if (ctx.in.takeKeyword("i64"sv)) {
    return ctx.makeI64();
  } else if (ctx.in.takeKeyword("f32"sv)) {
    return ctx.makeF32();
  } else if (ctx.in.takeKeyword("f64"sv)) {
    return ctx.makeF64();
  } else if (ctx.in.takeKeyword("v128"sv)) {
    return ctx.makeV128();
  } else if (auto type = reftype(ctx)) {
    CHECK_ERR(type);
    return *type;
  } else {
    return ctx.in.err("expected valtype");
  }
}